

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_suite.cpp
# Opt level: O1

void __thiscall reader_path_suite::test_empty::test_method(test_empty *this)

{
  bool bVar1;
  value vVar2;
  int iVar3;
  view_type *view;
  char input [1];
  string_type *local_1a8;
  undefined1 local_19c [4];
  char *local_198;
  string_type local_190;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  char *local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  string_type **local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  string_type **local_118;
  char **local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  shared_count sStack_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  size_t local_d0;
  value local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  input[0] = '\0';
  local_e8._8_8_ = strlen(input);
  local_c8 = end;
  local_e8._0_8_ = input;
  local_d8 = input;
  local_d0 = local_e8._8_8_;
  trial::url::reader::basic_path<char>::first((basic_path<char> *)local_e8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x17);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00186260;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  vVar2 = trial::url::reader::base<char,_trial::url::reader::basic_path>::code
                    ((base<char,_trial::url::reader::basic_path> *)local_e8);
  local_110 = &local_198;
  local_198 = (char *)CONCAT44(local_198._4_4_,vVar2);
  local_1a8 = (string_type *)local_19c;
  local_19c = (undefined1  [4])0x0;
  local_190._M_dataplus._M_p._0_1_ = vVar2 == end;
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_f8 = "";
  local_138 = (string_type **)&local_110;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00186558;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_1a8;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00186558;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,&local_170,&local_100,0x17,2,2,2,"reader.code()",&local_150,
             "url::token::code::end",&local_130);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_190.field_2._M_allocated_capacity);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x18);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00186260;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_190._M_dataplus._M_p._0_1_ = local_d0 == 0;
  local_158 = "";
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_f8 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00186598;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = (string_type **)&local_110;
  local_1a8 = (string_type *)0x172f49;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00186318;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_1a8;
  local_110 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,&local_170,&local_100,0x18,2,2,2,"reader.literal()",&local_150,"\"\"",
             &local_130);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_190.field_2._M_allocated_capacity);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x19);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00186260;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  trial::url::syntax::segment<char>::decode_abi_cxx11_(&local_190,(segment<char> *)&local_d8,view);
  iVar3 = std::__cxx11::string::compare((char *)&local_190);
  local_100 = (char *)CONCAT71(local_100._1_7_,iVar3 == 0);
  local_f8 = (char *)0x0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_110 = (char **)0x172d9a;
  local_108 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_001862d8;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_1a8;
  local_198 = "";
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00186318;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = (string_type **)&local_198;
  local_1a8 = &local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_170,&local_110,0x19,2,2,2,"reader.value<std::string>()",&local_150,
             "\"\"",&local_130);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_) !=
      &local_190.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_),
                    local_190.field_2._M_allocated_capacity + 1);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1a);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00186260;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  bVar1 = trial::url::reader::basic_path<char>::do_next((basic_path<char> *)local_e8);
  local_198 = (char *)CONCAT71(local_198._1_7_,bVar1);
  local_19c = (undefined1  [4])((uint)local_19c & 0xffffff00);
  local_190._M_dataplus._M_p._0_1_ = !bVar1;
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/path_suite.cpp"
  ;
  local_f8 = "";
  local_110 = &local_198;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_001865d8;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = (string_type *)local_19c;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_001865d8;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_1a8;
  local_138 = (string_type **)&local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,&local_170,&local_100,0x1a,2,2,2,"reader.next()",&local_150,"false",
             &local_130);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_190.field_2._M_allocated_capacity);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_empty)
{
    const char input[] = "";
    url::reader::path reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::end);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}